

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O2

void get_spanning_tree(void)

{
  uint uVar1;
  int v;
  pointer piVar2;
  pointer ppVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int i;
  int iVar7;
  long lVar8;
  int j;
  ulong uVar9;
  long lVar10;
  size_type __n;
  size_type __n_00;
  pair<int,_std::pair<int,_int>_> *result;
  pointer ppVar11;
  reference rVar12;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  edges_weights;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  results;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  used;
  uint local_a8;
  int iStack_a4;
  uint uStack_a0;
  _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  local_98;
  _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  local_78;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_58;
  pair<int,_std::pair<int,_int>_> local_40;
  
  freopen("spanning.txt","w",_stdout);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar7 = 0; iVar7 < V; iVar7 = iVar7 + 1) {
    local_a8 = local_a8 & 0xffffff00;
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::emplace_back<int&,bool>
              ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                *)&local_58,&V,(bool *)&local_a8);
  }
  for (__n_00 = 0; (long)__n_00 < (long)V; __n_00 = __n_00 + 1) {
    for (uVar9 = 0;
        piVar2 = edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[__n_00].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar9 < (ulong)((long)edge.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[__n_00].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
        uVar9 = uVar9 + 1) {
      uVar1 = piVar2[uVar9];
      __n = (size_type)(int)uVar1;
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (local_58.
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + __n_00,__n);
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
        uStack_a0 = uVar1 | (uint)(__n_00 >> 0x20);
        local_a8 = weight.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[__n_00].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar9];
        iStack_a4 = (int)__n_00;
        local_40.second.first = iStack_a4;
        local_40.first = local_a8;
        local_40.second.second = uVar1;
        std::
        vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
        ::emplace_back<std::pair<int,std::pair<int,int>>>
                  ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                    *)&local_98,&local_40);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (local_58.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __n_00,__n);
        *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (local_58.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __n,__n_00);
        *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
      }
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<int,std::pair<int,int>>>>>
            (local_98._M_impl.super__Vector_impl_data._M_start,
             local_98._M_impl.super__Vector_impl_data._M_finish);
  for (local_a8 = 0; (int)local_a8 < V; local_a8 = local_a8 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::p,
               (value_type_conflict *)&local_a8);
  }
  lVar10 = 0;
  for (lVar8 = 0; ppVar3 = local_78._M_impl.super__Vector_impl_data._M_finish,
      ppVar11 = local_78._M_impl.super__Vector_impl_data._M_start, lVar8 < E; lVar8 = lVar8 + 1) {
    iVar7 = *(int *)((long)&((local_98._M_impl.super__Vector_impl_data._M_start)->second).first +
                    lVar10);
    v = *(int *)((long)&((local_98._M_impl.super__Vector_impl_data._M_start)->second).second +
                lVar10);
    iVar4 = dsu_get(iVar7);
    iVar5 = dsu_get(v);
    if (iVar4 != iVar5) {
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::push_back((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                   *)&local_78,
                  (value_type *)
                  ((long)&(local_98._M_impl.super__Vector_impl_data._M_start)->first + lVar10));
      dsu_unite(iVar7,v);
    }
    lVar10 = lVar10 + 0xc;
  }
  for (; ppVar11 != ppVar3; ppVar11 = ppVar11 + 1) {
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(ppVar11->second).first]);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(ppVar11->second).second]);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar11->first);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_58);
  std::
  _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&local_78);
  std::
  _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&local_98);
  return;
}

Assistant:

void get_spanning_tree() {
    freopen("spanning.txt", "w", stdout); // output file

    vector < pair < int, pair<int, int> > > edges_weights, results;

    vector < vector<bool> > used;
    for (int i = 0; i < V; i++) {
        used.emplace_back(V, false);
    }

    for (int i = 0; i < V; i++) {
        for (int j = 0; j < edge[i].size(); j++) {
            int cur_v = edge[i][j];
            if (!used[i][cur_v]) {
                edges_weights.push_back(make_pair(weight[i][j], make_pair(i, cur_v)));
                used[i][cur_v] = true;
                used[cur_v][i] = true;
            }
        }
    }

    sort(edges_weights.begin(), edges_weights.end(), greater< pair < int, pair<int, int> > >());

    for (int i = 0; i < V; i++) {
        p.push_back(i);
    }

    for (int i = 0; i < E; i++) {
        int u = edges_weights[i].second.first;
        int v = edges_weights[i].second.second;
        int w = edges_weights[i].first;
        (void)w;

        if (dsu_get(u) != dsu_get(v)) {
            results.push_back(edges_weights[i]);
            dsu_unite(u, v);
        }
    }

    for (const auto& result : results) {
        cout << id[result.second.first] << " " << id[result.second.second] << " " << result.first << endl;
    }
}